

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void polyscope::view::setViewFromJson(string *jsonData,bool flyTo)

{
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  reference j_00;
  undefined4 *puVar4;
  long lVar5;
  int i;
  int iVar6;
  undefined7 in_register_00000031;
  int j_1;
  long lVar7;
  undefined4 uVar8;
  json j;
  float ret;
  value_type matData;
  mat4 newViewMat;
  stringstream s;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_338;
  undefined1 local_328 [19];
  undefined4 uStack_315;
  uint uStack_311;
  undefined1 uStack_30d;
  uint uStack_30c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  pointer local_2e8;
  pointer local_2e0;
  undefined4 local_2d8;
  undefined4 local_2d4;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_2d0;
  long *local_2b0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2a8;
  key_type local_298;
  key_type local_278;
  key_type local_258;
  key_type local_238;
  key_type local_218;
  mat4 local_1f8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  uVar8 = windowHeight;
  local_338.m_type = null;
  local_2d4 = windowWidth;
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)jsonData,_S_out|_S_in);
  nlohmann::operator>>((istream *)local_1b8,&local_338);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_338,"viewMat");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_2a8,pvVar3);
  local_2b0 = (long *)0xc088480000000000;
  if (local_2a8.m_type == array) {
    if ((long)((local_2a8.m_value.array)->
              super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)((local_2a8.m_value.array)->
              super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              )._M_impl.super__Vector_impl_data._M_start != 0x100) goto LAB_001fc550;
    local_2d0.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_2d0.m_it.array_iterator._M_current =
         ((local_2a8.m_value.array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    if ((local_2a8.m_type != object) ||
       (((local_2a8.m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0x10)) {
LAB_001fc550:
      bVar2 = false;
      local_2e0 = (pointer)0xc088480000000000;
      local_2e8 = (pointer)0xc088480000000000;
      goto LAB_001fcbd8;
    }
    local_2d0.m_it.array_iterator._M_current = (pointer)0x0;
    local_2d0.m_it.object_iterator._M_node =
         ((local_2a8.m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  local_2d0.m_it.primitive_iterator.m_it = 0;
  iVar6 = 0;
  local_2d8 = (int)CONCAT71(in_register_00000031,flyTo);
  local_2d0.m_object = &local_2a8;
  do {
    lVar5 = 0;
    lVar7 = 0;
    do {
      j_00 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*(&local_2d0);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
                (j_00,(float *)&local_308);
      if (iVar6 == 1) {
        puVar4 = (undefined4 *)((long)local_1f8.value + lVar7 * 0x10U + 4U);
      }
      else if (iVar6 == 2) {
        puVar4 = (undefined4 *)((long)local_1f8.value + lVar7 * 0x10U + 8U);
      }
      else if (iVar6 == 3) {
        puVar4 = (undefined4 *)((long)local_1f8.value + lVar7 * 0x10U + 0xcU);
      }
      else {
        puVar4 = (undefined4 *)((long)local_1f8.value + lVar5);
      }
      *puVar4 = local_308._M_dataplus._M_p._0_4_;
      if ((local_2d0.m_object)->m_type == array) {
        local_2d0.m_it.array_iterator._M_current = local_2d0.m_it.array_iterator._M_current + 1;
      }
      else if ((local_2d0.m_object)->m_type == object) {
        local_2d0.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_2d0.m_it.object_iterator._M_node);
      }
      else {
        local_2d0.m_it.primitive_iterator.m_it = local_2d0.m_it.primitive_iterator.m_it + 1;
      }
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 4);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_338,"fov");
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
            (pvVar3,(double *)&local_308);
  local_2b0 = (long *)local_308._M_dataplus._M_p;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"nearClipRatio","");
  local_308.field_2._8_8_ = 0;
  local_308._M_string_length = 0;
  local_308.field_2._M_allocated_capacity = 0;
  if (local_338.m_type == object) {
    local_308._M_dataplus._M_p = (pointer)&local_338;
    local_308._M_string_length =
         (size_type)
         std::
         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
         ::find(&(local_338.m_value.object)->_M_t,&local_218);
LAB_001fc590:
    local_328._8_8_ = (_Base_ptr)0x0;
    local_328._16_3_ = 0;
    uStack_315 = 0;
    uStack_311._1_3_ = 0;
    uStack_311._0_1_ = 0;
    if (local_338.m_type == array) goto LAB_001fc5c4;
    if (local_338.m_type == object) {
      local_328._8_8_ = &((local_338.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_311._0_1_ = 0;
      uStack_311._1_3_ = 1;
    }
  }
  else {
    if (local_338.m_type != array) {
      local_308.field_2._8_8_ = 1;
      local_308._M_dataplus._M_p = (pointer)&local_338;
      goto LAB_001fc590;
    }
    local_308.field_2._M_allocated_capacity =
         *(undefined8 *)
          &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              *)&(local_338.m_value.array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            )->super__Rb_tree_header)._M_header;
    local_308._M_dataplus._M_p = (pointer)&local_338;
LAB_001fc5c4:
    uStack_311._1_3_ = 0;
    local_328._8_8_ = (_Base_ptr)0x0;
    uVar1 = *(undefined8 *)
             &((_Rb_tree_header *)&(local_338.m_value.string)->_M_string_length)->_M_header;
    local_328._16_3_ = (undefined3)uVar1;
    uStack_315 = (undefined4)((ulong)uVar1 >> 0x18);
    uStack_311._0_1_ = (byte)((ulong)uVar1 >> 0x38);
  }
  local_328._0_8_ = &local_338;
  uStack_30c = 0;
  uStack_30d = 0;
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_308,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (bVar2) {
    local_2e0 = (pointer)0xc088480000000000;
  }
  else {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_338,"nearClipRatio");
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (pvVar3,(double *)&local_308);
    local_2e0 = local_308._M_dataplus._M_p;
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"farClipRatio","");
  local_308.field_2._8_8_ = 0;
  local_308._M_string_length = 0;
  local_308.field_2._M_allocated_capacity = 0;
  if (local_338.m_type == object) {
    local_308._M_dataplus._M_p = (pointer)&local_338;
    local_308._M_string_length =
         (size_type)
         std::
         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
         ::find(&(local_338.m_value.object)->_M_t,&local_238);
LAB_001fc6cd:
    local_328._8_8_ = (_Base_ptr)0x0;
    local_328._16_3_ = 0;
    uStack_315 = 0;
    uStack_311._1_3_ = 0;
    uStack_311._0_1_ = 0;
    if (local_338.m_type == array) goto LAB_001fc701;
    if (local_338.m_type == object) {
      local_328._8_8_ = &((local_338.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_311._0_1_ = 0;
      uStack_311._1_3_ = 1;
    }
  }
  else {
    if (local_338.m_type != array) {
      local_308.field_2._8_8_ = 1;
      local_308._M_dataplus._M_p = (pointer)&local_338;
      goto LAB_001fc6cd;
    }
    local_308.field_2._M_allocated_capacity =
         *(undefined8 *)
          &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              *)&(local_338.m_value.array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            )->super__Rb_tree_header)._M_header;
    local_308._M_dataplus._M_p = (pointer)&local_338;
LAB_001fc701:
    uStack_311._1_3_ = 0;
    local_328._8_8_ = (_Base_ptr)0x0;
    uVar1 = *(undefined8 *)
             &((_Rb_tree_header *)&(local_338.m_value.string)->_M_string_length)->_M_header;
    local_328._16_3_ = (undefined3)uVar1;
    uStack_315 = (undefined4)((ulong)uVar1 >> 0x18);
    uStack_311._0_1_ = (byte)((ulong)uVar1 >> 0x38);
  }
  local_328._0_8_ = &local_338;
  uStack_30c = 0;
  uStack_30d = 0;
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_308,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if (bVar2) {
    local_2e8 = (pointer)0xc088480000000000;
  }
  else {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_338,"farClipRatio");
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (pvVar3,(double *)&local_308);
    local_2e8 = local_308._M_dataplus._M_p;
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"windowWidth","");
  local_308.field_2._8_8_ = 0;
  local_308._M_string_length = 0;
  local_308.field_2._M_allocated_capacity = 0;
  if (local_338.m_type == object) {
    local_308._M_dataplus._M_p = (pointer)&local_338;
    local_308._M_string_length =
         (size_type)
         std::
         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
         ::find(&(local_338.m_value.object)->_M_t,&local_258);
LAB_001fc80a:
    local_328._8_8_ = (_Base_ptr)0x0;
    local_328._16_3_ = 0;
    uStack_315 = 0;
    uStack_311._1_3_ = 0;
    uStack_311._0_1_ = 0;
    if (local_338.m_type == array) goto LAB_001fc83e;
    if (local_338.m_type == object) {
      local_328._8_8_ = &((local_338.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_311._0_1_ = 0;
      uStack_311._1_3_ = 1;
    }
  }
  else {
    if (local_338.m_type != array) {
      local_308.field_2._8_8_ = 1;
      local_308._M_dataplus._M_p = (pointer)&local_338;
      goto LAB_001fc80a;
    }
    local_308.field_2._M_allocated_capacity =
         *(undefined8 *)
          &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              *)&(local_338.m_value.array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            )->super__Rb_tree_header)._M_header;
    local_308._M_dataplus._M_p = (pointer)&local_338;
LAB_001fc83e:
    uStack_311._1_3_ = 0;
    local_328._8_8_ = (_Base_ptr)0x0;
    uVar1 = *(undefined8 *)
             &((_Rb_tree_header *)&(local_338.m_value.string)->_M_string_length)->_M_header;
    local_328._16_3_ = (undefined3)uVar1;
    uStack_315 = (undefined4)((ulong)uVar1 >> 0x18);
    uStack_311._0_1_ = (byte)((ulong)uVar1 >> 0x38);
  }
  local_328._0_8_ = &local_338;
  uStack_30c = 0;
  uStack_30d = 0;
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_308,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (!bVar2) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_338,"windowWidth");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
              (pvVar3,(int *)&local_308);
    local_2d4 = local_308._M_dataplus._M_p._0_4_;
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"windowHeight","");
  local_308.field_2._8_8_ = 0;
  local_308._M_string_length = 0;
  local_308.field_2._M_allocated_capacity = 0;
  if (local_338.m_type == object) {
    local_308._M_dataplus._M_p = (pointer)&local_338;
    local_308._M_string_length =
         (size_type)
         std::
         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
         ::find(&(local_338.m_value.object)->_M_t,&local_278);
LAB_001fc939:
    local_328._8_8_ = (_Base_ptr)0x0;
    local_328._16_3_ = 0;
    uStack_315 = 0;
    uStack_311._1_3_ = 0;
    uStack_311._0_1_ = 0;
    if (local_338.m_type == array) goto LAB_001fc96d;
    if (local_338.m_type == object) {
      local_328._8_8_ = &((local_338.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_311._0_1_ = 0;
      uStack_311._1_3_ = 1;
    }
  }
  else {
    if (local_338.m_type != array) {
      local_308.field_2._8_8_ = 1;
      local_308._M_dataplus._M_p = (pointer)&local_338;
      goto LAB_001fc939;
    }
    local_308.field_2._M_allocated_capacity =
         *(undefined8 *)
          &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              *)&(local_338.m_value.array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            )->super__Rb_tree_header)._M_header;
    local_308._M_dataplus._M_p = (pointer)&local_338;
LAB_001fc96d:
    uStack_311._1_3_ = 0;
    local_328._8_8_ = (_Base_ptr)0x0;
    uVar1 = *(undefined8 *)
             &((_Rb_tree_header *)&(local_338.m_value.string)->_M_string_length)->_M_header;
    local_328._16_3_ = (undefined3)uVar1;
    uStack_315 = (undefined4)((ulong)uVar1 >> 0x18);
    uStack_311._0_1_ = (byte)((ulong)uVar1 >> 0x38);
  }
  local_328._0_8_ = &local_338;
  uStack_30c = 0;
  uStack_30d = 0;
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_308,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (!bVar2) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_338,"windowHeight");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
              (pvVar3,(int *)&local_308);
    uVar8 = local_308._M_dataplus._M_p._0_4_;
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"projectionMode","");
  local_308.field_2._8_8_ = 0;
  local_308._M_string_length = 0;
  local_308.field_2._M_allocated_capacity = 0;
  if (local_338.m_type == object) {
    local_308._M_dataplus._M_p = (pointer)&local_338;
    local_308._M_string_length =
         (size_type)
         std::
         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
         ::find(&(local_338.m_value.object)->_M_t,&local_298);
LAB_001fca6c:
    local_328._8_8_ = (_Base_ptr)0x0;
    local_328._16_3_ = 0;
    uStack_315 = 0;
    uStack_311 = 0;
    if (local_338.m_type == array) goto LAB_001fcaa0;
    if (local_338.m_type == object) {
      local_328._8_8_ = &((local_338.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_311 = 0x100;
    }
  }
  else {
    if (local_338.m_type != array) {
      local_308.field_2._8_8_ = 1;
      local_308._M_dataplus._M_p = (pointer)&local_338;
      goto LAB_001fca6c;
    }
    local_308.field_2._M_allocated_capacity =
         *(undefined8 *)
          &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              *)&(local_338.m_value.array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            )->super__Rb_tree_header)._M_header;
    local_308._M_dataplus._M_p = (pointer)&local_338;
LAB_001fcaa0:
    local_328._8_8_ = (_Base_ptr)0x0;
    uVar1 = *(undefined8 *)
             &((_Rb_tree_header *)&(local_338.m_value.string)->_M_string_length)->_M_header;
    local_328._16_3_ = (undefined3)uVar1;
    uStack_315 = (undefined4)((ulong)uVar1 >> 0x18);
    uStack_311._0_1_ = (byte)((ulong)uVar1 >> 0x38);
    uStack_311 = (uint)(byte)uStack_311;
  }
  local_328._0_8_ = &local_338;
  uStack_30c = 0;
  uStack_30d = 0;
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_308,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  flyTo = SUB41(local_2d8,0);
  if (!bVar2) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_338,"projectionMode");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_308,pvVar3);
    local_328._0_8_ = local_328 + 0x10;
    local_328._16_3_ = 0x726550;
    uStack_315 = 0x63657073;
    uStack_311 = 0x65766974;
    local_328._8_8_ = (_Base_ptr)0xb;
    uStack_30d = 0;
    if ((_Base_ptr)local_308._M_string_length == (_Base_ptr)0xb) {
      if (*(long *)(local_308._M_dataplus._M_p + 3) == 0x6576697463657073 &&
          *(long *)local_308._M_dataplus._M_p == 0x7463657073726550) {
        projectionMode = 0;
      }
    }
    else {
      uStack_30d = 99;
      local_328._16_3_ = 0x74724f;
      uStack_315 = 0x72676f68;
      uStack_311 = 0x69687061;
      local_328._8_8_ = &DAT_0000000c;
      uStack_30c = uStack_30c & 0xffffff00;
      if (((_Base_ptr)local_308._M_string_length == (_Base_ptr)&DAT_0000000c) &&
         ((int)*(long *)(local_308._M_dataplus._M_p + 8) == 0x63696870 &&
          *(long *)local_308._M_dataplus._M_p == 0x6172676f6874724f)) {
        projectionMode = 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
  }
  bVar2 = true;
LAB_001fcbd8:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_2a8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_338);
  if (bVar2) {
    windowWidth = local_2d4;
    windowHeight = uVar8;
    bVar2 = isInitialized();
    if (bVar2) {
      (**(code **)(*render::engine + 0x98))();
    }
    if (0.0 < (double)local_2e0) {
      nearClipRatio = local_2e0;
    }
    if (0.0 < (double)local_2e8) {
      farClipRatio = local_2e8;
    }
    if (flyTo == false) {
      viewMat._0_4_ = local_1f8.value[0].field_0;
      viewMat._4_4_ = local_1f8.value[0].field_1;
      DAT_005fc68c = local_1f8.value[0].field_2;
      _DAT_005fc690 = local_1f8.value[0].field_3;
      DAT_005fc694._0_4_ = local_1f8.value[1].field_0;
      DAT_005fc694._4_4_ = local_1f8.value[1].field_1;
      DAT_005fc69c = local_1f8.value[1].field_2;
      _DAT_005fc6a0 = local_1f8.value[1].field_3;
      DAT_005fc6a4._0_4_ = local_1f8.value[2].field_0;
      DAT_005fc6a4._4_4_ = local_1f8.value[2].field_1;
      DAT_005fc6ac._0_4_ = local_1f8.value[2].field_2;
      DAT_005fc6ac._4_4_ = local_1f8.value[2].field_3;
      DAT_005fc6b4._0_4_ = local_1f8.value[3].field_0;
      DAT_005fc6b4._4_4_ = local_1f8.value[3].field_1;
      DAT_005fc6bc._0_4_ = local_1f8.value[3].field_2;
      DAT_005fc6bc._4_4_ = local_1f8.value[3].field_3;
      fov = local_2b0;
      requestRedraw();
    }
    else {
      startFlightTo(&local_1f8,(float)(double)fov,0.4);
    }
  }
  return;
}

Assistant:

void setViewFromJson(std::string jsonData, bool flyTo) {
  // Values will go here
  glm::mat4 newViewMat;
  double newFov = -777;
  double newNearClipRatio = -777;
  double newFarClipRatio = -777;

  int windowWidth = view::windowWidth;
  int windowHeight = view::windowHeight;

  try {

    // Deserialize
    json j;
    std::stringstream s(jsonData);
    s >> j;

    // Read out the data
    auto matData = j["viewMat"];
    if (matData.size() != 16) return; // check size
    auto it = matData.begin();
    for (int i = 0; i < 4; i++) {
      for (int j = 0; j < 4; j++) {
        newViewMat[j][i] = *it;
        it++;
      }
    }
    newFov = j["fov"];

    // Get the clip ratios, but only if present
    if (j.find("nearClipRatio") != j.end()) {
      newNearClipRatio = j["nearClipRatio"];
    }
    if (j.find("farClipRatio") != j.end()) {
      newFarClipRatio = j["farClipRatio"];
    }

    // Get the window sizes, if present
    if (j.find("windowWidth") != j.end()) {
      windowWidth = j["windowWidth"];
    }
    if (j.find("windowHeight") != j.end()) {
      windowHeight = j["windowHeight"];
    }

    if (j.find("projectionMode") != j.end()) {
      std::string projectionModeStr = j["projectionMode"];
      if (projectionModeStr == to_string(ProjectionMode::Perspective)) {
        view::projectionMode = ProjectionMode::Perspective;
      } else if (projectionModeStr == to_string(ProjectionMode::Orthographic)) {
        view::projectionMode = ProjectionMode::Orthographic;
      }
    }

  } catch (...) {
    // If anything goes wrong parsing, just give up
    return;
  }

  // === Assign the new values

  view::setWindowSize(windowWidth, windowHeight);

  if (newNearClipRatio > 0) nearClipRatio = newNearClipRatio;
  if (newFarClipRatio > 0) farClipRatio = newFarClipRatio;

  if (flyTo) {
    startFlightTo(newViewMat, fov);
  } else {
    viewMat = newViewMat;
    fov = newFov;
    requestRedraw();
  }
}